

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.h
# Opt level: O0

RecyclerWeakReference<const_Js::FunctionBody> * __thiscall
JsUtil::
WeaklyReferencedKeyDictionary<const_Js::FunctionBody,_Js::ScriptContext::RejitStats_*,_DefaultComparer<const_Js::FunctionBody_*>,_true>
::Insert(WeaklyReferencedKeyDictionary<const_Js::FunctionBody,_Js::ScriptContext::RejitStats_*,_DefaultComparer<const_Js::FunctionBody_*>,_true>
         *this,RecyclerWeakReference<const_Js::FunctionBody> *weakRef,RejitStats *value,int hash,
        uint bucket)

{
  int iVar1;
  bool bVar2;
  WeakRefDictionaryEntry<const_Js::FunctionBody,_Memory::WriteBarrierPtr<Js::ScriptContext::RejitStats>_>
  **ppWVar3;
  int **ppiVar4;
  RecyclerWeakReference<const_Js::FunctionBody> **ppRVar5;
  int local_2c;
  uint local_28;
  int index;
  uint bucket_local;
  int hash_local;
  RejitStats *value_local;
  RecyclerWeakReference<const_Js::FunctionBody> *weakRef_local;
  WeaklyReferencedKeyDictionary<const_Js::FunctionBody,_Js::ScriptContext::RejitStats_*,_DefaultComparer<const_Js::FunctionBody_*>,_true>
  *this_local;
  
  local_28 = bucket;
  if (this->freeCount < 1) {
    if (this->count == this->size) {
      bVar2 = Clean(this);
      if (bVar2) {
        local_2c = this->freeList;
        ppWVar3 = Memory::WriteBarrierPtr::operator_cast_to_WeakRefDictionaryEntry__
                            ((WriteBarrierPtr *)&this->entries);
        this->freeList = (*ppWVar3)[local_2c].next;
        this->freeCount = this->freeCount + -1;
      }
      else {
        Resize(this);
        local_28 = PrimePolicy::GetBucket(hash,this->size,this->modFunctionIndex);
        local_2c = this->count;
        this->count = this->count + 1;
      }
    }
    else {
      local_2c = this->count;
      this->count = this->count + 1;
    }
  }
  else {
    local_2c = this->freeList;
    ppWVar3 = Memory::WriteBarrierPtr::operator_cast_to_WeakRefDictionaryEntry__
                        ((WriteBarrierPtr *)&this->entries);
    this->freeList = (*ppWVar3)[local_2c].next;
    this->freeCount = this->freeCount + -1;
  }
  ppiVar4 = Memory::WriteBarrierPtr::operator_cast_to_int__((WriteBarrierPtr *)&this->buckets);
  iVar1 = (*ppiVar4)[local_28];
  ppWVar3 = Memory::WriteBarrierPtr::operator_cast_to_WeakRefDictionaryEntry__
                      ((WriteBarrierPtr *)&this->entries);
  (*ppWVar3)[local_2c].next = iVar1;
  ppWVar3 = Memory::WriteBarrierPtr::operator_cast_to_WeakRefDictionaryEntry__
                      ((WriteBarrierPtr *)&this->entries);
  Memory::WriteBarrierPtr<const_Memory::RecyclerWeakReference<const_Js::FunctionBody>_>::operator=
            (&(*ppWVar3)[local_2c].key,weakRef);
  ppWVar3 = Memory::WriteBarrierPtr::operator_cast_to_WeakRefDictionaryEntry__
                      ((WriteBarrierPtr *)&this->entries);
  (*ppWVar3)[local_2c].hash = hash;
  ppWVar3 = Memory::WriteBarrierPtr::operator_cast_to_WeakRefDictionaryEntry__
                      ((WriteBarrierPtr *)&this->entries);
  Memory::WriteBarrierPtr<Js::ScriptContext::RejitStats>::operator=
            (&(*ppWVar3)[local_2c].value,value);
  ppiVar4 = Memory::WriteBarrierPtr::operator_cast_to_int__((WriteBarrierPtr *)&this->buckets);
  (*ppiVar4)[local_28] = local_2c;
  this->version = this->version + 1;
  ppWVar3 = Memory::WriteBarrierPtr::operator_cast_to_WeakRefDictionaryEntry__
                      ((WriteBarrierPtr *)&this->entries);
  ppRVar5 = Memory::WriteBarrierPtr::operator_cast_to_RecyclerWeakReference__
                      ((WriteBarrierPtr *)&(*ppWVar3)[local_2c].key);
  return *ppRVar5;
}

Assistant:

const RecyclerWeakReference<TKey>* Insert(const RecyclerWeakReference<TKey>* weakRef, TValue value, int hash, uint bucket)
        {
            int index;
            if (freeCount > 0)
            {
                index = freeList;
                freeList = entries[index].next;
                freeCount--;
            }
            else
            {
                if (count == size)
                {
                    if (cleanOnInsert && Clean())
                    {
                        index = freeList;
                        freeList = entries[index].next;
                        freeCount--;
                    }
                    else
                    {
                        Resize();
                        bucket = PrimePolicy::GetBucket(hash, size, modFunctionIndex);
                        index = count;
                        count++;
                    }
                }
                else
                {
                    index = count;
                    count++;
                }
            }

            entries[index].next = buckets[bucket];
            entries[index].key = weakRef;
            entries[index].hash = hash;
            entries[index].value = value;
            buckets[bucket] = index;
            version++;

            return entries[index].key;
        }